

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_get_crt_ext(uchar **p,uchar *end,mbedtls_x509_crt *crt,mbedtls_x509_crt_ext_cb_t cb,
                    void *p_ctx)

{
  undefined8 uVar1;
  int iVar2;
  uchar *end_00;
  uint local_80;
  int local_7c;
  int ext_type;
  int is_critical;
  mbedtls_x509_buf extn_oid;
  uchar *end_ext_octet;
  uchar *start_ext_octet;
  uchar *end_ext_data;
  size_t len;
  void *pvStack_38;
  int ret;
  void *p_ctx_local;
  mbedtls_x509_crt_ext_cb_t cb_local;
  mbedtls_x509_crt *crt_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_4_ = 0xffffff92;
  if (*p == end) {
    p_local._4_4_ = 0;
  }
  else {
    pvStack_38 = p_ctx;
    p_ctx_local = cb;
    cb_local = (mbedtls_x509_crt_ext_cb_t)crt;
    crt_local = (mbedtls_x509_crt *)end;
    end_local = (uchar *)p;
    p_local._4_4_ = mbedtls_x509_get_ext(p,end,&crt->v3_ext,3);
    if (p_local._4_4_ == 0) {
      crt_local = (mbedtls_x509_crt *)(*(long *)(cb_local + 0x1c0) + *(long *)(cb_local + 0x1b8));
      len._4_4_ = 0;
      do {
        do {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    if (crt_local <= *(mbedtls_x509_crt **)end_local) {
                      if (*(mbedtls_x509_crt **)end_local != crt_local) {
                        iVar2 = mbedtls_error_add(-0x2500,-0x66,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                                  ,0x425);
                        return iVar2;
                      }
                      return 0;
                    }
                    memset(&ext_type,0,0x18);
                    local_7c = 0;
                    local_80 = 0;
                    len._4_4_ = mbedtls_asn1_get_tag
                                          ((uchar **)end_local,(uchar *)crt_local,
                                           (size_t *)&end_ext_data,0x30);
                    if (len._4_4_ != 0) {
                      iVar2 = mbedtls_error_add(-0x2500,len._4_4_,
                                                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                                ,0x37b);
                      return iVar2;
                    }
                    end_00 = end_ext_data + *(long *)end_local;
                    len._4_4_ = mbedtls_asn1_get_tag
                                          ((uchar **)end_local,end_00,(size_t *)&extn_oid,6);
                    if (len._4_4_ != 0) {
                      iVar2 = mbedtls_error_add(-0x2500,len._4_4_,
                                                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                                ,899);
                      return iVar2;
                    }
                    ext_type = 6;
                    extn_oid.len = *(size_t *)end_local;
                    *(long *)end_local = extn_oid._0_8_ + *(long *)end_local;
                    len._4_4_ = mbedtls_asn1_get_bool((uchar **)end_local,end_00,&local_7c);
                    if ((len._4_4_ != 0) && (len._4_4_ != -0x62)) {
                      iVar2 = mbedtls_error_add(-0x2500,len._4_4_,
                                                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                                ,0x38d);
                      return iVar2;
                    }
                    len._4_4_ = mbedtls_asn1_get_tag
                                          ((uchar **)end_local,end_00,(size_t *)&end_ext_data,4);
                    if (len._4_4_ != 0) {
                      iVar2 = mbedtls_error_add(-0x2500,len._4_4_,
                                                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                                ,0x393);
                      return iVar2;
                    }
                    uVar1 = *(undefined8 *)end_local;
                    extn_oid.p = end_ext_data + *(long *)end_local;
                    if (extn_oid.p != end_00) {
                      iVar2 = mbedtls_error_add(-0x2500,-0x66,
                                                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                                ,0x39b);
                      return iVar2;
                    }
                    len._4_4_ = mbedtls_oid_get_x509_ext_type
                                          ((mbedtls_asn1_buf *)&ext_type,(int *)&local_80);
                    if (len._4_4_ == 0) break;
                    if (p_ctx_local == (void *)0x0) {
                      *(uchar **)end_local = extn_oid.p;
                      if (local_7c != 0) {
                        iVar2 = mbedtls_error_add(-0x2500,-0x62,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                                  ,0x3b4);
                        return iVar2;
                      }
                    }
                    else {
                      len._4_4_ = (*(code *)p_ctx_local)
                                            (pvStack_38,cb_local,&ext_type,local_7c,
                                             *(undefined8 *)end_local,extn_oid.p);
                      if ((len._4_4_ != 0) && (local_7c != 0)) {
                        return len._4_4_;
                      }
                      *(uchar **)end_local = extn_oid.p;
                    }
                  }
                  if ((*(uint *)(cb_local + 0x288) & local_80) != 0) {
                    return -0x2500;
                  }
                  *(uint *)(cb_local + 0x288) = *(uint *)(cb_local + 0x288) | local_80;
                  if (local_80 != 1) break;
                  iVar2 = x509_get_authority_key_id
                                    ((uchar **)end_local,extn_oid.p,
                                     (mbedtls_x509_authority *)(cb_local + 0x200));
                  if (iVar2 != 0) {
                    return iVar2;
                  }
                  len._4_4_ = 0;
                }
                if (local_80 != 2) break;
                iVar2 = x509_get_subject_key_id
                                  ((uchar **)end_local,end_00,(mbedtls_x509_buf *)(cb_local + 0x1e8)
                                  );
                if (iVar2 != 0) {
                  return iVar2;
                }
                len._4_4_ = 0;
              }
              if (local_80 != 4) break;
              iVar2 = mbedtls_x509_get_key_usage
                                ((uchar **)end_local,extn_oid.p,(uint *)(cb_local + 0x294));
              if (iVar2 != 0) {
                return iVar2;
              }
              len._4_4_ = 0;
            }
            if (local_80 == 8) break;
            if (local_80 == 0x20) {
              iVar2 = mbedtls_x509_get_subject_alt_name
                                ((uchar **)end_local,extn_oid.p,
                                 (mbedtls_x509_sequence *)(cb_local + 0x1c8));
              if (iVar2 != 0) {
                return iVar2;
              }
              len._4_4_ = 0;
            }
            else if (local_80 == 0x100) {
              iVar2 = x509_get_basic_constraints
                                ((uchar **)end_local,extn_oid.p,(int *)(cb_local + 0x28c),
                                 (int *)(cb_local + 0x290));
              if (iVar2 != 0) {
                return iVar2;
              }
              len._4_4_ = 0;
            }
            else if (local_80 == 0x800) {
              iVar2 = x509_get_ext_key_usage
                                ((uchar **)end_local,extn_oid.p,
                                 (mbedtls_x509_sequence *)(cb_local + 0x298));
              if (iVar2 != 0) {
                return iVar2;
              }
              len._4_4_ = 0;
            }
            else if (local_80 == 0x10000) {
              iVar2 = mbedtls_x509_get_ns_cert_type
                                ((uchar **)end_local,extn_oid.p,(uchar *)(cb_local + 0x2b8));
              if (iVar2 != 0) {
                return iVar2;
              }
              len._4_4_ = 0;
            }
            else {
              if (local_7c != 0) {
                return -0x2080;
              }
              *(uchar **)end_local = extn_oid.p;
            }
          }
          len._4_4_ = x509_get_certificate_policies
                                ((uchar **)end_local,extn_oid.p,
                                 (mbedtls_x509_sequence *)(cb_local + 0x268));
        } while ((len._4_4_ == 0) ||
                (((len._4_4_ == -0x2080 && (p_ctx_local != (void *)0x0)) &&
                 (iVar2 = (*(code *)p_ctx_local)
                                    (pvStack_38,cb_local,&ext_type,local_7c,uVar1,extn_oid.p),
                 iVar2 == 0))));
        if (local_7c != 0) {
          return len._4_4_;
        }
      } while (len._4_4_ == -0x2080);
      p_local._4_4_ = len._4_4_;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_crt_ext(unsigned char **p,
                            const unsigned char *end,
                            mbedtls_x509_crt *crt,
                            mbedtls_x509_crt_ext_cb_t cb,
                            void *p_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;
    unsigned char *end_ext_data, *start_ext_octet, *end_ext_octet;

    if (*p == end) {
        return 0;
    }

    if ((ret = mbedtls_x509_get_ext(p, end, &crt->v3_ext, 3)) != 0) {
        return ret;
    }

    end = crt->v3_ext.p + crt->v3_ext.len;
    while (*p < end) {
        /*
         * Extension  ::=  SEQUENCE  {
         *      extnID      OBJECT IDENTIFIER,
         *      critical    BOOLEAN DEFAULT FALSE,
         *      extnValue   OCTET STRING  }
         */
        mbedtls_x509_buf extn_oid = { 0, 0, NULL };
        int is_critical = 0; /* DEFAULT FALSE */
        int ext_type = 0;

        if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                        MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        end_ext_data = *p + len;

        /* Get extension ID */
        if ((ret = mbedtls_asn1_get_tag(p, end_ext_data, &extn_oid.len,
                                        MBEDTLS_ASN1_OID)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        extn_oid.tag = MBEDTLS_ASN1_OID;
        extn_oid.p = *p;
        *p += extn_oid.len;

        /* Get optional critical */
        if ((ret = mbedtls_asn1_get_bool(p, end_ext_data, &is_critical)) != 0 &&
            (ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG)) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        /* Data should be octet string type */
        if ((ret = mbedtls_asn1_get_tag(p, end_ext_data, &len,
                                        MBEDTLS_ASN1_OCTET_STRING)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        start_ext_octet = *p;
        end_ext_octet = *p + len;

        if (end_ext_octet != end_ext_data) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                     MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
        }

        /*
         * Detect supported extensions
         */
        ret = mbedtls_oid_get_x509_ext_type(&extn_oid, &ext_type);

        if (ret != 0) {
            /* Give the callback (if any) a chance to handle the extension */
            if (cb != NULL) {
                ret = cb(p_ctx, crt, &extn_oid, is_critical, *p, end_ext_octet);
                if (ret != 0 && is_critical) {
                    return ret;
                }
                *p = end_ext_octet;
                continue;
            }

            /* No parser found, skip extension */
            *p = end_ext_octet;

            if (is_critical) {
                /* Data is marked as critical: fail */
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                         MBEDTLS_ERR_ASN1_UNEXPECTED_TAG);
            }
            continue;
        }

        /* Forbid repeated extensions */
        if ((crt->ext_types & ext_type) != 0) {
            return MBEDTLS_ERR_X509_INVALID_EXTENSIONS;
        }

        crt->ext_types |= ext_type;

        switch (ext_type) {
            case MBEDTLS_X509_EXT_BASIC_CONSTRAINTS:
                /* Parse basic constraints */
                if ((ret = x509_get_basic_constraints(p, end_ext_octet,
                                                      &crt->ca_istrue, &crt->max_pathlen)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_KEY_USAGE:
                /* Parse key usage */
                if ((ret = mbedtls_x509_get_key_usage(p, end_ext_octet,
                                                      &crt->key_usage)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE:
                /* Parse extended key usage */
                if ((ret = x509_get_ext_key_usage(p, end_ext_octet,
                                                  &crt->ext_key_usage)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_SUBJECT_KEY_IDENTIFIER:
                /* Parse subject key identifier */
                if ((ret = x509_get_subject_key_id(p, end_ext_data,
                                                   &crt->subject_key_id)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_AUTHORITY_KEY_IDENTIFIER:
                /* Parse authority key identifier */
                if ((ret = x509_get_authority_key_id(p, end_ext_octet,
                                                     &crt->authority_key_id)) != 0) {
                    return ret;
                }
                break;
            case MBEDTLS_X509_EXT_SUBJECT_ALT_NAME:
                /* Parse subject alt name
                 * SubjectAltName ::= GeneralNames
                 */
                if ((ret = mbedtls_x509_get_subject_alt_name(p, end_ext_octet,
                                                             &crt->subject_alt_names)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_X509_EXT_NS_CERT_TYPE:
                /* Parse netscape certificate type */
                if ((ret = mbedtls_x509_get_ns_cert_type(p, end_ext_octet,
                                                         &crt->ns_cert_type)) != 0) {
                    return ret;
                }
                break;

            case MBEDTLS_OID_X509_EXT_CERTIFICATE_POLICIES:
                /* Parse certificate policies type */
                if ((ret = x509_get_certificate_policies(p, end_ext_octet,
                                                         &crt->certificate_policies)) != 0) {
                    /* Give the callback (if any) a chance to handle the extension
                     * if it contains unsupported policies */
                    if (ret == MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE && cb != NULL &&
                        cb(p_ctx, crt, &extn_oid, is_critical,
                           start_ext_octet, end_ext_octet) == 0) {
                        break;
                    }

                    if (is_critical) {
                        return ret;
                    } else
                    /*
                     * If MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE is returned, then we
                     * cannot interpret or enforce the policy. However, it is up to
                     * the user to choose how to enforce the policies,
                     * unless the extension is critical.
                     */
                    if (ret != MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE) {
                        return ret;
                    }
                }
                break;

            default:
                /*
                 * If this is a non-critical extension, which the oid layer
                 * supports, but there isn't an x509 parser for it,
                 * skip the extension.
                 */
                if (is_critical) {
                    return MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE;
                } else {
                    *p = end_ext_octet;
                }
        }
    }

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}